

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpl_grammar.h
# Opt level: O0

int __thiscall VPLGrammar::Parser::UnaryOperatorNode::GetType(UnaryOperatorNode *this)

{
  UnaryOperatorNode *this_local;
  
  return 0x1e;
}

Assistant:

virtual void BuildProgram(vpl::Scope* scope, std::ostream& out) const override {
                switch (children_[0]->GetType()) {
                    case kMinusType:
                        out << "    neg\n";
                        break;
                    case kNotType:
                        out << "    not\n";
                        break;
                    case kBitwiseNotType:
                        out << "    push -1\n";
                        out << "    xor\n";
                        break;
                }
            }